

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O2

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  _func_int *p_Var1;
  long in_RSI;
  _func_int **local_20;
  
  std::make_unique<cmCTestRunScriptCommand>();
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  local_20[3] = *(_func_int **)(in_RSI + 0x18);
  local_20[4] = p_Var1;
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand = local_20;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestRunScriptCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }